

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  _Bool _Var4;
  uint uVar5;
  sparc_reg sVar6;
  MCOperand *op;
  int64_t iVar7;
  long lVar8;
  ulong uVar9;
  char *fmt;
  int iVar10;
  
  op = MCInst_getOperand(MI,opNum);
  _Var4 = MCOperand_isReg(op);
  if (_Var4) {
    uVar5 = MCOperand_getReg(op);
    SStream_concat0(O,"%");
    SStream_concat0(O,getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar5 - 1) * 4));
    sVar6 = Sparc_map_register(uVar5);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar2 = MI->flat_insn->detail;
    uVar9 = (ulong)(pcVar2->field_6).x86.rex;
    if (MI->csh->doing_mem == true) {
      lVar8 = uVar9 * 0xc;
      if (pcVar2->groups[lVar8 + 0x1e] != '\0') {
        pcVar2->groups[lVar8 + 0x1f] = (uint8_t)sVar6;
        return;
      }
      pcVar2->groups[lVar8 + 0x1e] = (uint8_t)sVar6;
      return;
    }
    puVar1 = pcVar2->groups + uVar9 * 0xc + 0x1a;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(sparc_reg *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.rex * 0xc + 0x1e) = sVar6;
    goto LAB_001b8ceb;
  }
  _Var4 = MCOperand_isImm(op);
  if (!_Var4) {
    return;
  }
  iVar7 = MCOperand_getImm(op);
  uVar5 = (uint)iVar7;
  switch(MI->Opcode) {
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x95:
  case 0x96:
    iVar10 = (int)(uVar5 << 10) >> 8;
    break;
  default:
    goto switchD_001b8bf3_caseD_4a;
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
    iVar10 = (int)(uVar5 << 0xd) >> 0xb;
    break;
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
    iVar10 = (int)(short)iVar7 << 2;
    break;
  case 0x72:
    iVar10 = (int)(uVar5 << 2) >> 2;
  }
  uVar5 = iVar10 + (int)MI->address;
switchD_001b8bf3_caseD_4a:
  if ((int)uVar5 < 0) {
    uVar3 = -uVar5;
    if (uVar5 < 0xfffffff7) {
      fmt = "-0x%x";
    }
    else {
      fmt = "-%u";
    }
  }
  else {
    uVar3 = uVar5;
    if (uVar5 < 10) {
      fmt = "%u";
    }
    else {
      fmt = "0x%x";
    }
  }
  SStream_concat(O,fmt,(ulong)uVar3);
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar2 = MI->flat_insn->detail;
  uVar9 = (ulong)(pcVar2->field_6).x86.rex;
  if (MI->csh->doing_mem == true) {
    *(uint *)(pcVar2->groups + uVar9 * 0xc + 0x22) = uVar5;
    return;
  }
  puVar1 = pcVar2->groups + uVar9 * 0xc + 0x1a;
  puVar1[0] = '\x02';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  pcVar2 = MI->flat_insn->detail;
  *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.rex * 0xc + 0x1e) = uVar5;
LAB_001b8ceb:
  puVar1 = &(MI->flat_insn->detail->field_6).x86.rex;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned reg = MCOperand_getReg(Op);
#ifndef CAPSTONE_DIET
		char *RegName = getRegisterName(reg);
#endif
		// map to public register
		reg = PPC_map_register(reg);
#ifndef CAPSTONE_DIET
		// The linux and AIX assembler does not take register prefixes.
		if (MI->csh->syntax == CS_OPT_SYNTAX_NOREGNAME)
			RegName = stripRegisterPrefix(RegName);

		SStream_concat0(O, RegName);
#endif

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_REG;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].reg = reg;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}

		return;
	}

	if (MCOperand_isImm(Op)) {
		int32_t imm = (int32_t)MCOperand_getImm(Op);
		if (imm >= 0) {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", imm);
			else
				SStream_concat(O, "%u", imm);
		} else {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -imm);
			else
				SStream_concat(O, "-%u", -imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = imm;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}
	}
}